

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

StatusOr<long> __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseInt<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,
          Field<google::protobuf::json_internal::ParseProto3Type> field)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Status *x;
  LocationWith<long> *pLVar4;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 extraout_RDX;
  StatusOr<long> SVar5;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  JsonLocation local_70;
  Status _status;
  StatusOr<google::protobuf::json_internal::LocationWith<long>_> n;
  Field<google::protobuf::json_internal::ParseProto3Type> field_local;
  JsonLexer *lex_local;
  
  ParseIntInner<long>((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)&_status,lex
                      ,-9007199254740992.0,9007199254740992.0);
  x = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<long>_>::status
                ((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)&_status);
  absl::lts_20240722::Status::Status((Status *)&local_70.path,x);
  bVar2 = absl::lts_20240722::Status::ok((Status *)&local_70.path);
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (bVar2) {
    absl::lts_20240722::StatusOr<long>::StatusOr<const_absl::lts_20240722::Status,_0>
              ((StatusOr<long> *)this,(Status *)&local_70.path);
  }
  local_70.line._0_4_ = (uint)bVar2;
  absl::lts_20240722::Status::~Status((Status *)&local_70.path);
  if ((uint)local_70.line != 0) goto LAB_004c3260;
  bVar2 = Proto3Type::Is32Bit(field);
  if (bVar2) {
    iVar3 = std::numeric_limits<int>::min();
    pLVar4 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<long>_>::
             operator->((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)&_status);
    if ((long)iVar3 <= pLVar4->value) {
      pLVar4 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<long>_>::
               operator->((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)&_status
                         );
      lVar1 = pLVar4->value;
      iVar3 = std::numeric_limits<int>::max();
      if (lVar1 <= iVar3) goto LAB_004c3232;
    }
    pLVar4 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<long>_>::
             operator->((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)&_status);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"integer out of range");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid(&local_70,&pLVar4->loc,local_80._M_len,local_80._M_str);
    absl::lts_20240722::StatusOr<long>::StatusOr<absl::lts_20240722::Status,_0>
              ((StatusOr<long> *)this,(Status *)&local_70);
    absl::lts_20240722::Status::~Status((Status *)&local_70);
    local_70.line._0_4_ = 1;
  }
  else {
LAB_004c3232:
    pLVar4 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<long>_>::
             operator->((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)&_status);
    absl::lts_20240722::StatusOr<long>::StatusOr<long_&,_0>((StatusOr<long> *)this,&pLVar4->value);
    local_70.line._0_4_ = 1;
  }
LAB_004c3260:
  absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<long>_>::~StatusOr
            ((StatusOr<google::protobuf::json_internal::LocationWith<long>_> *)&_status);
  SVar5.super_StatusOrData<long>.field_1.data_ = extraout_RDX.data_;
  SVar5.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)this;
  return (StatusOr<long>)SVar5.super_StatusOrData<long>;
}

Assistant:

absl::StatusOr<int64_t> ParseInt(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<LocationWith<int64_t>> n =
      ParseIntInner<int64_t>(lex, -9007199254740992.0, 9007199254740992.0);
  RETURN_IF_ERROR(n.status());

  if (Traits::Is32Bit(field)) {
    if (std::numeric_limits<int32_t>::min() > n->value ||
        n->value > std::numeric_limits<int32_t>::max()) {
      return n->loc.Invalid("integer out of range");
    }
  }

  return n->value;
}